

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::torrent::tracker_request_error
          (torrent *this,tracker_request *r,error_code *ec,string *msg,seconds32 retry_interval)

{
  byte bVar1;
  uint uVar2;
  pointer paVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  pointer pcVar5;
  pointer paVar6;
  ulong uVar7;
  undefined8 uVar8;
  bool bVar9;
  undefined3 uVar10;
  char cVar11;
  uint8_t e;
  int iVar12;
  time_point32 now;
  announce_entry *this_00;
  undefined4 extraout_var;
  announce_endpoint *paVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  error_category *peVar14;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  pointer paVar15;
  endpoint *ep;
  endpoint *extraout_RDX;
  endpoint *ep_00;
  endpoint *extraout_RDX_00;
  endpoint *extraout_RDX_01;
  endpoint *extraout_RDX_02;
  endpoint *ep_01;
  pointer paVar16;
  long lVar17;
  long lVar18;
  undefined8 uVar19;
  bool bVar20;
  endpoint local_endpoint_1;
  int fails;
  endpoint local_endpoint;
  undefined1 local_b8 [44];
  uint local_8c;
  libtorrent *local_88;
  string *local_80;
  data_union local_78;
  tracker_request *local_58;
  ulong local_50;
  generic_error_category *local_48;
  
  local_88 = (libtorrent *)CONCAT44(local_88._4_4_,retry_interval.__r);
  local_80 = msg;
  iVar12 = (*(this->super_request_callback)._vptr_request_callback[6])();
  if ((char)iVar12 != '\0') {
    uVar2 = ec->val_;
    (*ec->cat_->_vptr_error_category[4])(local_b8,ec->cat_,(ulong)uVar2);
    (*(this->super_request_callback)._vptr_request_callback[7])
              (this,"*** tracker error: (%d) %s %s",(ulong)uVar2,local_b8._0_8_,
               (local_80->_M_dataplus)._M_p);
    if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
      operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
    }
  }
  bVar1 = r->kind;
  this_00 = find_tracker(this,&r->url);
  if ((bVar1 & 1) == 0) {
    local_8c = 0;
    local_78.v6.sin6_scope_id = 0;
    local_78.base.sa_data[6] = '\0';
    local_78.base.sa_data[7] = '\0';
    local_78.base.sa_data[8] = '\0';
    local_78.base.sa_data[9] = '\0';
    local_78.base.sa_data[10] = '\0';
    local_78.base.sa_data[0xb] = '\0';
    local_78.base.sa_data[0xc] = '\0';
    local_78.base.sa_data[0xd] = '\0';
    local_78._16_8_ = 0;
    local_78._0_8_ = 2;
    if (this_00 != (announce_entry *)0x0) {
      paVar15 = (this_00->endpoints).
                super__Vector_base<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar3 = (this_00->endpoints).
               super__Vector_base<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      p_Var4 = (r->outgoing_socket).m_sock.
               super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      lVar18 = (long)paVar3 - (long)paVar15;
      lVar17 = (lVar18 >> 3) * -0x1111111111111111 >> 2;
      if (0 < lVar17) {
        lVar18 = lVar17 + 1;
        paVar16 = paVar15 + 2;
        do {
          if (paVar16[-2].socket.m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == p_Var4) {
            paVar16 = paVar16 + -2;
            goto LAB_002c76b5;
          }
          if (paVar16[-1].socket.m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == p_Var4) {
            paVar16 = paVar16 + -1;
            goto LAB_002c76b5;
          }
          if ((paVar16->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == p_Var4) goto LAB_002c76b5;
          if (paVar16[1].socket.m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi == p_Var4) {
            paVar16 = paVar16 + 1;
            goto LAB_002c76b5;
          }
          lVar18 = lVar18 + -1;
          paVar16 = paVar16 + 4;
        } while (1 < lVar18);
        lVar18 = (long)paVar3 - (long)(paVar15 + lVar17 * 4);
        paVar15 = paVar15 + lVar17 * 4;
      }
      lVar17 = (lVar18 >> 3) * -0x1111111111111111;
      if (lVar17 == 1) {
LAB_002c7695:
        paVar16 = paVar15;
        if ((paVar15->socket).m_sock.
            super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != p_Var4) {
          paVar16 = paVar3;
        }
LAB_002c76b5:
        if (paVar16 == paVar3) goto LAB_002c77ef;
        local_78._0_8_ = *(undefined8 *)&(paVar16->local_endpoint).impl_.data_;
        local_78.v4.sin_zero = *(uchar (*) [8])((long)&(paVar16->local_endpoint).impl_.data_ + 8);
        local_78._16_8_ = *(undefined8 *)((long)&(paVar16->local_endpoint).impl_.data_ + 0x10);
        local_78.v6.sin6_scope_id = (paVar16->local_endpoint).impl_.data_.v6.sin6_scope_id;
        local_58 = r;
        iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2d])();
        local_b8._0_8_ = CONCAT44(extraout_var_01,iVar12) + 0x3b0;
        local_b8._8_4_ = local_b8._8_4_ & 0xffffff00;
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_b8);
        local_b8[8] = 1;
        iVar12 = *(int *)(CONCAT44(extraout_var_01,iVar12) + 0x330);
        std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b8);
        announce_endpoint::failed(paVar16,iVar12,local_88._0_4_);
        bVar20 = ec->failed_;
        uVar10 = *(undefined3 *)&ec->field_0x5;
        peVar14 = ec->cat_;
        (paVar16->last_error).val_ = ec->val_;
        (paVar16->last_error).failed_ = bVar20;
        *(undefined3 *)&(paVar16->last_error).field_0x5 = uVar10;
        (paVar16->last_error).cat_ = peVar14;
        std::__cxx11::string::_M_assign((string *)paVar16);
        r = local_58;
        local_8c = *(ushort *)&paVar16->field_0x74 & 0x7f;
        local_88 = (libtorrent *)&paVar16->local_endpoint;
        print_endpoint_abi_cxx11_((string *)local_b8,(libtorrent *)&paVar16->local_endpoint,ep);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** increment tracker fail count [ep: %s url: %s %d]",local_b8._0_8_,
                   (r->url)._M_dataplus._M_p,(ulong)(*(ushort *)&paVar16->field_0x74 & 0x7f));
        if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
          operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
        }
        local_b8._0_8_ = (undefined1 *)0x100000061;
        local_b8._8_4_ = 0x455670;
        local_b8._12_4_ = 0;
        iVar12 = (*ec->cat_->_vptr_error_category[2])(ec->cat_,(ulong)(uint)ec->val_);
        ep_01 = extraout_RDX;
        if (((char)iVar12 == '\0') &&
           (cVar11 = (**(code **)(*(long *)CONCAT44(local_b8._12_4_,local_b8._8_4_) + 0x18))
                               ((long *)CONCAT44(local_b8._12_4_,local_b8._8_4_),ec,
                                local_b8._0_8_ & 0xffffffff), ep_01 = extraout_RDX_00,
           cVar11 == '\0')) {
          local_50 = 0x100000071;
          local_48 = &boost::system::detail::cat_holder<void>::generic_category_instance;
          iVar12 = (*ec->cat_->_vptr_error_category[2])(ec->cat_,(ulong)(uint)ec->val_);
          ep_01 = extraout_RDX_01;
          if (((char)iVar12 != '\0') ||
             (iVar12 = (*(local_48->super_error_category)._vptr_error_category[3])
                                 (local_48,ec,local_50 & 0xffffffff), ep_01 = extraout_RDX_02,
             (char)iVar12 != '\0')) goto LAB_002c78d4;
        }
        else {
LAB_002c78d4:
          paVar16->field_0x75 = paVar16->field_0x75 & 0xf7;
          print_endpoint_abi_cxx11_((string *)local_b8,local_88,ep_01);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"*** disabling endpoint [ep: %s url: %s ]",local_b8._0_8_,
                     (r->url)._M_dataplus._M_p);
          if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
            operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
          }
        }
      }
      else {
        if (lVar17 == 2) {
LAB_002c768b:
          paVar16 = paVar15;
          if ((paVar15->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != p_Var4) {
            paVar15 = paVar15 + 1;
            goto LAB_002c7695;
          }
          goto LAB_002c76b5;
        }
        if (lVar17 == 3) {
          paVar16 = paVar15;
          if ((paVar15->socket).m_sock.
              super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != p_Var4) {
            paVar15 = paVar15 + 1;
            goto LAB_002c768b;
          }
          goto LAB_002c76b5;
        }
LAB_002c77ef:
        if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (p_Var4->_M_use_count != 0)) {
          pcVar5 = (r->url)._M_dataplus._M_p;
          aux::listen_socket_handle::get_local_endpoint((endpoint *)&local_50,&r->outgoing_socket);
          print_endpoint_abi_cxx11_((string *)local_b8,(libtorrent *)&local_50,ep_00);
          (*(this->super_request_callback)._vptr_request_callback[7])
                    (this,"*** no matching endpoint for request [%s, %s]",pcVar5,local_b8._0_8_);
          if ((undefined1 *)local_b8._0_8_ != local_b8 + 0x10) {
            operator_delete((void *)local_b8._0_8_,CONCAT44(local_b8._20_4_,local_b8._16_4_) + 1);
          }
        }
      }
      paVar6 = (this->m_trackers).
               super_vector<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>
               .
               super__Vector_base<libtorrent::announce_entry,_std::allocator<libtorrent::announce_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      peVar14 = http_category();
      if ((peVar14->id_ != 0x8fafd21e25c5e09b) && (peVar14->id_ != 0xb2ab117a257edf0d)) {
        (*peVar14->_vptr_error_category[6])(peVar14,0x19a);
      }
      if (ec->val_ == 0x19a) {
        bVar20 = ec->cat_->id_ == peVar14->id_;
        if (peVar14->id_ == 0) {
          bVar20 = ec->cat_ == peVar14;
        }
        if (bVar20) {
          this_00->fail_limit = '\x01';
        }
      }
      paVar15 = (this_00->endpoints).
                super__Vector_base<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      paVar3 = (this_00->endpoints).
               super__Vector_base<libtorrent::announce_endpoint,_std::allocator<libtorrent::announce_endpoint>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar18 = (long)paVar3 - (long)paVar15;
      lVar17 = (lVar18 >> 3) * -0x1111111111111111 >> 2;
      if (0 < lVar17) {
        lVar18 = lVar17 + 1;
        paVar16 = paVar15 + 2;
        do {
          if ((paVar16[-2].field_0x74 & 0x7f) == 0) {
            paVar16 = paVar16 + -2;
            goto LAB_002c7a5a;
          }
          if ((paVar16[-1].field_0x74 & 0x7f) == 0) {
            paVar16 = paVar16 + -1;
            goto LAB_002c7a5a;
          }
          if ((paVar16->field_0x74 & 0x7f) == 0) goto LAB_002c7a5a;
          if ((paVar16[1].field_0x74 & 0x7f) == 0) {
            paVar16 = paVar16 + 1;
            goto LAB_002c7a5a;
          }
          lVar18 = lVar18 + -1;
          paVar16 = paVar16 + 4;
        } while (1 < lVar18);
        lVar18 = (long)paVar3 - (long)(paVar15 + lVar17 * 4);
        paVar15 = paVar15 + lVar17 * 4;
      }
      lVar17 = (lVar18 >> 3) * -0x1111111111111111;
      if (lVar17 == 1) {
LAB_002c7a3a:
        paVar16 = paVar15;
        if ((paVar15->field_0x74 & 0x7f) != 0) {
          paVar16 = paVar3;
        }
LAB_002c7a5a:
        if (paVar16 != paVar3) goto LAB_002c7a72;
      }
      else {
        if (lVar17 == 2) {
LAB_002c7a30:
          paVar16 = paVar15;
          if ((paVar15->field_0x74 & 0x7f) != 0) {
            paVar15 = paVar15 + 1;
            goto LAB_002c7a3a;
          }
          goto LAB_002c7a5a;
        }
        if (lVar17 == 3) {
          paVar16 = paVar15;
          if ((paVar15->field_0x74 & 0x7f) != 0) {
            paVar15 = paVar15 + 1;
            goto LAB_002c7a30;
          }
          goto LAB_002c7a5a;
        }
      }
      deprioritize_tracker(this,(int)((ulong)((long)this_00 - (long)paVar6) >> 5) * -0x55555555);
    }
LAB_002c7a72:
    iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    if (((*(uint *)(CONCAT44(extraout_var_02,iVar12) + 0x68) & 0x11) != 0) ||
       (r->triggered_manually == true)) {
      iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      get_handle((torrent *)local_b8);
      alert_manager::
      emplace_alert<libtorrent::tracker_error_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,int&,std::__cxx11::string_const&,boost::system::error_code_const&,std::__cxx11::string_const&>
                ((alert_manager *)CONCAT44(extraout_var_03,iVar12),(torrent_handle *)local_b8,
                 (basic_endpoint<boost::asio::ip::tcp> *)&local_78.base,(int *)&local_8c,&r->url,ec,
                 local_80);
      uVar19._4_1_ = local_b8[0xc];
      uVar19._5_1_ = local_b8[0xd];
      uVar19._6_1_ = local_b8[0xe];
      uVar19._7_1_ = local_b8[0xf];
      uVar19._0_1_ = local_b8[8];
      uVar19._1_1_ = local_b8[9];
      uVar19._2_1_ = local_b8[10];
      uVar19._3_1_ = local_b8[0xb];
LAB_002c7ad5:
      if ((uchar  [8])uVar19 != (uchar  [8])0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          lVar17 = uVar19 + 0xc;
          iVar12 = *(int *)lVar17;
          *(int *)lVar17 = *(int *)lVar17 + -1;
          UNLOCK();
        }
        else {
          iVar12 = *(int *)(uVar19 + 0xc);
          *(int *)(uVar19 + 0xc) = iVar12 + -1;
        }
        if (iVar12 == 1) {
          (**(code **)(*(long *)uVar19 + 0x18))();
        }
      }
    }
  }
  else {
    peVar14 = http_category();
    if ((peVar14->id_ != 0x8fafd21e25c5e09b) && (peVar14->id_ != 0xb2ab117a257edf0d)) {
      (*peVar14->_vptr_error_category[6])(peVar14,0x19a);
    }
    if (ec->val_ == 0x19a) {
      bVar9 = ec->cat_->id_ == peVar14->id_;
      if (peVar14->id_ == 0) {
        bVar9 = ec->cat_ == peVar14;
      }
      bVar20 = this_00 != (announce_entry *)0x0;
      if ((bVar20) && (bVar9)) {
        this_00->fail_limit = '\x01';
        bVar20 = true;
      }
    }
    else {
      bVar20 = this_00 != (announce_entry *)0x0;
    }
    iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    if (((*(uint *)(CONCAT44(extraout_var,iVar12) + 0x68) & 0x11) != 0) ||
       (r->triggered_manually == true)) {
      local_b8._8_4_ = 0;
      local_b8._12_4_ = 0;
      local_b8._16_4_ = 0;
      local_b8._20_4_ = 0;
      local_b8._24_4_ = 0;
      local_b8._0_8_ = (undefined1 *)0x2;
      if ((bVar20) &&
         (paVar13 = announce_entry::find_endpoint(this_00,&r->outgoing_socket),
         paVar13 != (announce_endpoint *)0x0)) {
        local_b8._0_8_ = *(undefined8 *)&(paVar13->local_endpoint).impl_.data_;
        uVar19 = *(undefined8 *)((long)&(paVar13->local_endpoint).impl_.data_ + 8);
        uVar8 = *(undefined8 *)((long)&(paVar13->local_endpoint).impl_.data_ + 0x14);
        local_b8._16_4_ =
             (undefined4)
             ((ulong)*(undefined8 *)((long)&(paVar13->local_endpoint).impl_.data_ + 0xc) >> 0x20);
        local_b8._20_4_ = (undefined4)uVar8;
        local_b8._24_4_ = (undefined4)((ulong)uVar8 >> 0x20);
        local_b8._8_4_ = (undefined4)uVar19;
        local_b8._12_4_ = (undefined4)((ulong)uVar19 >> 0x20);
      }
      iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                 _vptr_session_logger[5])();
      get_handle((torrent *)&local_78.base);
      alert_manager::
      emplace_alert<libtorrent::scrape_failed_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,std::__cxx11::string_const&,boost::system::error_code_const&>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar12),(torrent_handle *)&local_78.base,
                 (basic_endpoint<boost::asio::ip::tcp> *)local_b8,&r->url,ec);
      uVar19 = local_78.v4.sin_zero;
      goto LAB_002c7ad5;
    }
  }
  uVar7 = *(ulong *)&(this->super_torrent_hot_members).field_0x38;
  if (((uint)uVar7 >> 0x1a & 1) == 0) {
    e = r->event;
    if (e != '\x03' && (uVar7 & 0x18000000) != 0) goto LAB_002c7b41;
  }
  else {
    e = '\x03';
    if (r->event != '\x03') goto LAB_002c7b41;
  }
  announce_with_tracker(this,e);
LAB_002c7b41:
  now = aux::time_now32();
  update_tracker_timer(this,now);
  return;
}

Assistant:

void torrent::tracker_request_error(tracker_request const& r
		, error_code const& ec, std::string const& msg
		, seconds32 const retry_interval)
	{
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("*** tracker error: (%d) %s %s", ec.value()
				, ec.message().c_str(), msg.c_str());
		}
#endif
		if (0 == (r.kind & tracker_request::scrape_request))
		{
			// announce request
			announce_entry* ae = find_tracker(r.url);
			int fails = 0;
			tcp::endpoint local_endpoint;
			if (ae)
			{
				auto aep = std::find_if(ae->endpoints.begin(), ae->endpoints.end()
					, [&](announce_endpoint const& e) { return e.socket == r.outgoing_socket; });

				if (aep != ae->endpoints.end())
				{
					local_endpoint = aep->local_endpoint;
					aep->failed(settings().get_int(settings_pack::tracker_backoff)
						, retry_interval);
					aep->last_error = ec;
					aep->message = msg;
					fails = aep->fails;
#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** increment tracker fail count [ep: %s url: %s %d]"
						, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str(), aep->fails);
#endif
					// don't try to announce from this endpoint again
					if (ec == boost::system::errc::address_family_not_supported
						|| ec == boost::system::errc::host_unreachable)
					{
						aep->enabled = false;
#ifndef TORRENT_DISABLE_LOGGING
						debug_log("*** disabling endpoint [ep: %s url: %s ]"
							, print_endpoint(aep->local_endpoint).c_str(), r.url.c_str());
#endif
					}
				}
				else if (r.outgoing_socket)
				{
#ifndef TORRENT_DISABLE_LOGGING
					debug_log("*** no matching endpoint for request [%s, %s]"
						, r.url.c_str(), print_endpoint(r.outgoing_socket.get_local_endpoint()).c_str());
#endif
				}

				int const tracker_index = int(ae - m_trackers.data());

				// never talk to this tracker again
				if (ec == error_code(410, http_category())) ae->fail_limit = 1;

				// if all endpoints fail, then we de-prioritize the tracker and try
				// the next one in the tier
				if (std::all_of(ae->endpoints.begin(), ae->endpoints.end()
					, [](announce_endpoint const& ep) { return ep.fails > 0; }))
				{
					deprioritize_tracker(tracker_index);
				}
			}
			if (m_ses.alerts().should_post<tracker_error_alert>()
				|| r.triggered_manually)
			{
				m_ses.alerts().emplace_alert<tracker_error_alert>(get_handle()
					, local_endpoint, fails, r.url, ec, msg);
			}
		}
		else
		{
			announce_entry* ae = find_tracker(r.url);

			// scrape request
			if (ec == error_code(410, http_category()))
			{
				// never talk to this tracker again
				if (ae != nullptr) ae->fail_limit = 1;
			}

			// if this was triggered manually we need to post this unconditionally,
			// since the client expects a response from its action, regardless of
			// whether all tracker events have been enabled by the alert mask
			if (m_ses.alerts().should_post<scrape_failed_alert>()
				|| r.triggered_manually)
			{
				tcp::endpoint local_endpoint;
				if (ae != nullptr)
				{
					auto aep = ae->find_endpoint(r.outgoing_socket);
					if (aep != nullptr) local_endpoint = aep->local_endpoint;
				}

				m_ses.alerts().emplace_alert<scrape_failed_alert>(get_handle(), local_endpoint, r.url, ec);
			}
		}
		// announce to the next working tracker
		if ((!m_abort && !is_paused()) || r.event == tracker_request::stopped)
			announce_with_tracker(r.event);
		update_tracker_timer(aux::time_now32());
	}